

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# m68kops.c
# Opt level: O2

void m68k_op_move_32_pi_aw(void)

{
  uint address;
  uint value;
  ulong uVar1;
  
  value = OPER_AW_32();
  uVar1 = (ulong)(m68ki_cpu.ir >> 7 & 0x1c);
  address = *(uint *)((long)m68ki_cpu.dar + uVar1 + 0x20);
  *(uint *)((long)m68ki_cpu.dar + uVar1 + 0x20) = address + 4;
  m68ki_write_32_fc(address,m68ki_cpu.s_flag | 1,value);
  m68ki_cpu.n_flag = value >> 0x18;
  m68ki_cpu.not_z_flag = value;
  m68ki_cpu.v_flag = 0;
  m68ki_cpu.c_flag = 0;
  return;
}

Assistant:

static void m68k_op_move_32_pi_aw(void)
{
	uint res = OPER_AW_32();
	uint ea = EA_AX_PI_32();

	m68ki_write_32(ea, res);

	FLAG_N = NFLAG_32(res);
	FLAG_Z = res;
	FLAG_V = VFLAG_CLEAR;
	FLAG_C = CFLAG_CLEAR;
}